

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void rw::Matrix::invertOrthonormal(Matrix *dst,Matrix *src)

{
  Matrix *src_local;
  Matrix *dst_local;
  
  (dst->right).x = (src->right).x;
  (dst->right).y = (src->up).x;
  (dst->right).z = (src->at).x;
  (dst->up).x = (src->right).y;
  (dst->up).y = (src->up).y;
  (dst->up).z = (src->at).y;
  (dst->at).x = (src->right).z;
  (dst->at).y = (src->up).z;
  (dst->at).z = (src->at).z;
  (dst->pos).x = (float32)-((float)(src->pos).z * (float)(src->right).z +
                           (float)(src->pos).x * (float)(src->right).x +
                           (float)(src->pos).y * (float)(src->right).y);
  (dst->pos).y = (float32)-((float)(src->pos).z * (float)(src->up).z +
                           (float)(src->pos).x * (float)(src->up).x +
                           (float)(src->pos).y * (float)(src->up).y);
  (dst->pos).z = (float32)-((float)(src->pos).z * (float)(src->at).z +
                           (float)(src->pos).x * (float)(src->at).x +
                           (float)(src->pos).y * (float)(src->at).y);
  dst->flags = 3;
  return;
}

Assistant:

void
Matrix::invertOrthonormal(Matrix *dst, const Matrix *src)
{
	dst->right.x = src->right.x;
	dst->right.y = src->up.x;
	dst->right.z = src->at.x;
	dst->up.x = src->right.y;
	dst->up.y = src->up.y;
	dst->up.z = src->at.y;
	dst->at.x = src->right.z;
	dst->at.y = src->up.z;
	dst->at.z = src->at.z;
	dst->pos.x = -(src->pos.x*src->right.x +
	               src->pos.y*src->right.y +
	               src->pos.z*src->right.z);
	dst->pos.y = -(src->pos.x*src->up.x +
	               src->pos.y*src->up.y +
	               src->pos.z*src->up.z);
	dst->pos.z = -(src->pos.x*src->at.x +
	               src->pos.y*src->at.y +
	               src->pos.z*src->at.z);
	dst->flags = TYPEORTHONORMAL;
}